

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

int sam_hdr_vadd(SAM_hdr *sh,char *type,__va_list_tag *ap,...)

{
  char cVar1;
  char cVar2;
  size_t sVar3;
  SAM_hdr_item_s *pSVar4;
  SAM_hdr_item_s *pSVar5;
  SAM_hdr_type *pSVar6;
  char in_AL;
  khint_t kVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  char *pcVar11;
  SAM_hdr_tag_s *pSVar12;
  undefined8 *puVar13;
  SAM_hdr_tag *pSVar14;
  char *pcVar15;
  uint uVar16;
  int iVar17;
  undefined8 in_RCX;
  ulong uVar18;
  size_t sVar19;
  size_t sVar20;
  undefined8 in_R8;
  undefined8 in_R9;
  size_t sVar21;
  size_t sVar22;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  int new;
  SAM_hdr_tag *local_150;
  undefined8 *local_140;
  int local_10c;
  SAM_hdr_tag *local_108;
  SAM_hdr_type *local_100;
  char *local_f8;
  __va_list_tag *local_f0;
  undefined8 local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  cVar1 = *type;
  cVar2 = type[1];
  uVar18 = (sh->text).l;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((sh->text).m < uVar18 + 1) {
    uVar18 = uVar18 >> 1 | uVar18;
    uVar18 = uVar18 >> 2 | uVar18;
    uVar18 = uVar18 >> 4 | uVar18;
    uVar18 = uVar18 >> 8 | uVar18;
    sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
    (sh->text).m = sVar19;
    pcVar10 = (char *)realloc((sh->text).s,sVar19);
    if (pcVar10 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar10;
  }
  sVar3 = (sh->text).l;
  (sh->text).l = sVar3 + 1;
  (sh->text).s[sVar3] = '@';
  uVar18 = (sh->text).l + 3;
  if ((sh->text).m <= uVar18) {
    uVar18 = uVar18 >> 1 | uVar18;
    uVar18 = uVar18 >> 2 | uVar18;
    uVar18 = uVar18 >> 4 | uVar18;
    uVar18 = uVar18 >> 8 | uVar18;
    sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
    (sh->text).m = sVar19;
    pcVar10 = (char *)realloc((sh->text).s,sVar19);
    if (pcVar10 == (char *)0x0) {
      return -1;
    }
    (sh->text).s = pcVar10;
  }
  *(undefined2 *)((sh->text).s + (sh->text).l) = *(undefined2 *)type;
  sVar3 = (sh->text).l;
  (sh->text).l = sVar3 + 2;
  (sh->text).s[sVar3 + 2] = '\0';
  local_100 = (SAM_hdr_type *)pool_alloc(sh->type_pool);
  if (local_100 == (SAM_hdr_type *)0x0) {
    return -1;
  }
  kVar7 = kh_put_sam_hdr(sh->h,(int)cVar1 << 8 | (int)cVar2,&local_10c);
  if (kVar7 == 0xffffffff) {
    return -1;
  }
  sh->h->vals[kVar7] = local_100;
  local_f8 = type;
  local_f0 = ap;
  if (local_10c == 0) {
    pSVar4 = sh->h->vals[kVar7];
    pSVar5 = pSVar4->prev;
    pSVar5->next = pSVar4;
    if (pSVar4 == (SAM_hdr_item_s *)0x0) {
      __assert_fail("p->next = t",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/sam_header.c"
                    ,0x1bd,"int sam_hdr_vadd(SAM_hdr *, const char *, struct __va_list_tag *, ...)")
      ;
    }
    pSVar5->next = local_100;
    local_100->prev = pSVar5;
    pSVar4->prev = local_100;
    local_100->next = pSVar4;
    iVar9 = pSVar5->order + 1;
  }
  else {
    local_100->next = local_100;
    local_100->prev = local_100;
    iVar9 = 0;
  }
  local_100->order = iVar9;
  local_140 = (undefined8 *)&stack0x00000008;
  uVar16 = 0x18;
  local_108 = (SAM_hdr_tag *)&local_100->tag;
  local_150 = (SAM_hdr_tag *)0x0;
  do {
    uVar18 = (ulong)uVar16;
    if (uVar18 < 0x29) {
      uVar16 = uVar16 + 8;
      puVar13 = (undefined8 *)((long)local_e8 + uVar18);
    }
    else {
      puVar13 = local_140;
      local_140 = local_140 + 1;
    }
    pcVar10 = (char *)*puVar13;
    if (pcVar10 == (char *)0x0) {
      iVar9 = 2;
    }
    else {
      uVar18 = (ulong)uVar16;
      if (uVar18 < 0x29) {
        uVar16 = uVar16 + 8;
        puVar13 = (undefined8 *)((long)local_e8 + uVar18);
      }
      else {
        puVar13 = local_140;
        local_140 = local_140 + 1;
      }
      pcVar15 = (char *)*puVar13;
      uVar18 = (sh->text).l;
      if ((sh->text).m < uVar18 + 1) {
        uVar18 = uVar18 >> 1 | uVar18;
        uVar18 = uVar18 >> 2 | uVar18;
        uVar18 = uVar18 >> 4 | uVar18;
        uVar18 = uVar18 >> 8 | uVar18;
        sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
        (sh->text).m = sVar19;
        pcVar11 = (char *)realloc((sh->text).s,sVar19);
        if (pcVar11 == (char *)0x0) {
          iVar9 = 1;
          goto LAB_00139a0d;
        }
        (sh->text).s = pcVar11;
      }
      sVar3 = (sh->text).l;
      (sh->text).l = sVar3 + 1;
      (sh->text).s[sVar3] = '\t';
      pSVar12 = (SAM_hdr_tag_s *)pool_alloc(sh->tag_pool);
      iVar9 = 1;
      if (pSVar12 != (SAM_hdr_tag_s *)0x0) {
        sVar3 = (sh->text).l;
        sVar19 = strlen(pcVar10);
        sVar21 = (size_t)(int)sVar19;
        uVar18 = sVar21 + sVar3 + 1;
        if ((sh->text).m <= uVar18) {
          uVar18 = uVar18 >> 1 | uVar18;
          uVar18 = uVar18 >> 2 | uVar18;
          uVar18 = uVar18 >> 4 | uVar18;
          uVar18 = uVar18 >> 8 | uVar18;
          sVar20 = (uVar18 >> 0x10 | uVar18) + 1;
          (sh->text).m = sVar20;
          pcVar11 = (char *)realloc((sh->text).s,sVar20);
          if (pcVar11 == (char *)0x0) goto LAB_00139a0d;
          (sh->text).s = pcVar11;
        }
        memcpy((sh->text).s + (sh->text).l,pcVar10,sVar21);
        sVar22 = sVar21 + (sh->text).l;
        (sh->text).l = sVar22;
        (sh->text).s[sVar22] = '\0';
        if ((int)sVar19 != -1) {
          uVar18 = (sh->text).l;
          if ((sh->text).m < uVar18 + 1) {
            uVar18 = uVar18 >> 1 | uVar18;
            uVar18 = uVar18 >> 2 | uVar18;
            uVar18 = uVar18 >> 4 | uVar18;
            uVar18 = uVar18 >> 8 | uVar18;
            sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
            (sh->text).m = sVar19;
            pcVar10 = (char *)realloc((sh->text).s,sVar19);
            if (pcVar10 == (char *)0x0) goto LAB_00139a0d;
            (sh->text).s = pcVar10;
          }
          sVar22 = (sh->text).l;
          (sh->text).l = sVar22 + 1;
          (sh->text).s[sVar22] = ':';
          sVar19 = strlen(pcVar15);
          sVar21 = (size_t)(int)sVar19;
          uVar18 = (sh->text).l + sVar21 + 1;
          if ((sh->text).m <= uVar18) {
            uVar18 = uVar18 >> 1 | uVar18;
            uVar18 = uVar18 >> 2 | uVar18;
            uVar18 = uVar18 >> 4 | uVar18;
            uVar18 = uVar18 >> 8 | uVar18;
            sVar20 = (uVar18 >> 0x10 | uVar18) + 1;
            (sh->text).m = sVar20;
            pcVar10 = (char *)realloc((sh->text).s,sVar20);
            if (pcVar10 == (char *)0x0) goto LAB_00139a0d;
            (sh->text).s = pcVar10;
          }
          memcpy((sh->text).s + (sh->text).l,pcVar15,sVar21);
          sVar22 = sVar21 + (sh->text).l;
          (sh->text).l = sVar22;
          (sh->text).s[sVar22] = '\0';
          if ((int)sVar19 != -1) {
            iVar17 = (int)sVar3;
            iVar8 = (int)(sh->text).l - iVar17;
            pSVar12->len = iVar8;
            pcVar10 = string_ndup(sh->str_pool,(sh->text).s + iVar17,(long)iVar8);
            pSVar12->str = pcVar10;
            pSVar12->next = (SAM_hdr_tag_s *)0x0;
            if (pcVar10 != (char *)0x0) {
              if (local_150 == (SAM_hdr_tag *)0x0) {
                local_150 = local_108;
              }
              local_150->next = pSVar12;
              iVar9 = 0;
              local_150 = pSVar12;
            }
          }
        }
      }
    }
LAB_00139a0d:
  } while (iVar9 == 0);
  if (iVar9 == 2) {
    do {
      uVar16 = local_f0->gp_offset;
      if ((ulong)uVar16 < 0x29) {
        puVar13 = (undefined8 *)((ulong)uVar16 + (long)local_f0->reg_save_area);
        local_f0->gp_offset = uVar16 + 8;
      }
      else {
        puVar13 = (undefined8 *)local_f0->overflow_arg_area;
        local_f0->overflow_arg_area = puVar13 + 1;
      }
      pcVar10 = (char *)*puVar13;
      if (pcVar10 == (char *)0x0) {
        iVar9 = 4;
      }
      else {
        uVar16 = local_f0->gp_offset;
        if ((ulong)uVar16 < 0x29) {
          puVar13 = (undefined8 *)((ulong)uVar16 + (long)local_f0->reg_save_area);
          local_f0->gp_offset = uVar16 + 8;
        }
        else {
          puVar13 = (undefined8 *)local_f0->overflow_arg_area;
          local_f0->overflow_arg_area = puVar13 + 1;
        }
        pcVar15 = (char *)*puVar13;
        uVar18 = (sh->text).l;
        if ((sh->text).m < uVar18 + 1) {
          uVar18 = uVar18 >> 1 | uVar18;
          uVar18 = uVar18 >> 2 | uVar18;
          uVar18 = uVar18 >> 4 | uVar18;
          uVar18 = uVar18 >> 8 | uVar18;
          sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
          (sh->text).m = sVar19;
          pcVar11 = (char *)realloc((sh->text).s,sVar19);
          if (pcVar11 == (char *)0x0) {
            iVar9 = 1;
            goto LAB_00139d06;
          }
          (sh->text).s = pcVar11;
        }
        sVar3 = (sh->text).l;
        (sh->text).l = sVar3 + 1;
        (sh->text).s[sVar3] = '\t';
        pSVar14 = (SAM_hdr_tag *)pool_alloc(sh->tag_pool);
        iVar9 = 1;
        if (pSVar14 != (SAM_hdr_tag *)0x0) {
          sVar3 = (sh->text).l;
          sVar19 = strlen(pcVar10);
          sVar21 = (size_t)(int)sVar19;
          uVar18 = sVar21 + sVar3 + 1;
          if ((sh->text).m <= uVar18) {
            uVar18 = uVar18 >> 1 | uVar18;
            uVar18 = uVar18 >> 2 | uVar18;
            uVar18 = uVar18 >> 4 | uVar18;
            uVar18 = uVar18 >> 8 | uVar18;
            sVar20 = (uVar18 >> 0x10 | uVar18) + 1;
            (sh->text).m = sVar20;
            pcVar11 = (char *)realloc((sh->text).s,sVar20);
            if (pcVar11 == (char *)0x0) goto LAB_00139d06;
            (sh->text).s = pcVar11;
          }
          memcpy((sh->text).s + (sh->text).l,pcVar10,sVar21);
          sVar22 = sVar21 + (sh->text).l;
          (sh->text).l = sVar22;
          (sh->text).s[sVar22] = '\0';
          if ((int)sVar19 != -1) {
            uVar18 = (sh->text).l;
            if ((sh->text).m < uVar18 + 1) {
              uVar18 = uVar18 >> 1 | uVar18;
              uVar18 = uVar18 >> 2 | uVar18;
              uVar18 = uVar18 >> 4 | uVar18;
              uVar18 = uVar18 >> 8 | uVar18;
              sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
              (sh->text).m = sVar19;
              pcVar10 = (char *)realloc((sh->text).s,sVar19);
              if (pcVar10 == (char *)0x0) goto LAB_00139d06;
              (sh->text).s = pcVar10;
            }
            sVar22 = (sh->text).l;
            (sh->text).l = sVar22 + 1;
            (sh->text).s[sVar22] = ':';
            sVar19 = strlen(pcVar15);
            sVar21 = (size_t)(int)sVar19;
            uVar18 = (sh->text).l + sVar21 + 1;
            if ((sh->text).m <= uVar18) {
              uVar18 = uVar18 >> 1 | uVar18;
              uVar18 = uVar18 >> 2 | uVar18;
              uVar18 = uVar18 >> 4 | uVar18;
              uVar18 = uVar18 >> 8 | uVar18;
              sVar20 = (uVar18 >> 0x10 | uVar18) + 1;
              (sh->text).m = sVar20;
              pcVar10 = (char *)realloc((sh->text).s,sVar20);
              if (pcVar10 == (char *)0x0) goto LAB_00139d06;
              (sh->text).s = pcVar10;
            }
            memcpy((sh->text).s + (sh->text).l,pcVar15,sVar21);
            sVar22 = sVar21 + (sh->text).l;
            (sh->text).l = sVar22;
            (sh->text).s[sVar22] = '\0';
            if ((int)sVar19 != -1) {
              iVar17 = (int)sVar3;
              iVar8 = (int)(sh->text).l - iVar17;
              pSVar14->len = iVar8;
              pcVar10 = string_ndup(sh->str_pool,(sh->text).s + iVar17,(long)iVar8);
              pSVar14->str = pcVar10;
              pSVar14->next = (SAM_hdr_tag_s *)0x0;
              if (pcVar10 != (char *)0x0) {
                if (local_150 == (SAM_hdr_tag *)0x0) {
                  local_150 = local_108;
                }
                local_150->next = pSVar14;
                iVar9 = 0;
                local_150 = pSVar14;
              }
            }
          }
        }
      }
LAB_00139d06:
      pcVar10 = local_f8;
    } while (iVar9 == 0);
    if (iVar9 == 4) {
      uVar18 = (sh->text).l + 1;
      if ((sh->text).m <= uVar18) {
        uVar18 = uVar18 >> 1 | uVar18;
        uVar18 = uVar18 >> 2 | uVar18;
        uVar18 = uVar18 >> 4 | uVar18;
        uVar18 = uVar18 >> 8 | uVar18;
        sVar19 = (uVar18 >> 0x10 | uVar18) + 1;
        (sh->text).m = sVar19;
        pcVar15 = (char *)realloc((sh->text).s,sVar19);
        if (pcVar15 == (char *)0x0) {
          return -1;
        }
        (sh->text).s = pcVar15;
      }
      pSVar6 = local_100;
      sVar3 = (sh->text).l;
      (sh->text).l = sVar3 + 1;
      (sh->text).s[sVar3] = '\n';
      (sh->text).s[(sh->text).l] = '\0';
      iVar9 = sam_hdr_update_hashes(sh,(int)pcVar10[1] | (int)*pcVar10 << 8,local_100);
      if (iVar9 != -1) {
        return pSVar6->order;
      }
      return -1;
    }
  }
  return -1;
}

Assistant:

int sam_hdr_vadd(SAM_hdr *sh, const char *type, va_list ap, ...) {
    va_list args;
    SAM_hdr_type *h_type;
    SAM_hdr_tag *h_tag, *last;
    int new;
    khint32_t type_i = (type[0]<<8) | type[1], k;

#if defined(HAVE_VA_COPY)
    va_list ap_local;
#endif

    if (EOF == kputc_('@', &sh->text))
	return -1;
    if (EOF == kputsn(type, 2, &sh->text))
	return -1;

    if (!(h_type = pool_alloc(sh->type_pool)))
	return -1;
    if (-1 == (k = kh_put(sam_hdr, sh->h, type_i, &new)))
	return -1;
    kh_val(sh->h, k) = h_type;

    // Form the ring, either with self or other lines of this type
    if (!new) {
	SAM_hdr_type *t = kh_val(sh->h, k), *p;
	p = t->prev;
	    
	assert(p->next = t);
	p->next = h_type;
	h_type->prev = p;

	t->prev = h_type;
	h_type->next = t;
	h_type->order = p->order + 1;
    } else {
	h_type->prev = h_type->next = h_type;
	h_type->order = 0;
    }

    last = NULL;

    // Any ... varargs
    va_start(args, ap);
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(args, char *)))
	    break;
	v = va_arg(args, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(args);

#if defined(HAVE_VA_COPY)
    va_copy(ap_local, ap);
#   define ap ap_local
#endif

    // Plus the specified va_list params
    for (;;) {
	char *k, *v;
	int idx;
	
	if (!(k = (char *)va_arg(ap, char *)))
	    break;
	v = va_arg(ap, char *);

	if (EOF == kputc_('\t', &sh->text))
	    return -1;

	if (!(h_tag = pool_alloc(sh->tag_pool)))
	    return -1;
	idx = ks_len(&sh->text);
	
	if (EOF == kputs(k, &sh->text))
	    return -1;
	if (EOF == kputc_(':', &sh->text))
	    return -1;
	if (EOF == kputs(v, &sh->text))
	    return -1;

	h_tag->len = ks_len(&sh->text) - idx;
	h_tag->str = string_ndup(sh->str_pool,
				 ks_str(&sh->text) + idx,
				 h_tag->len);
	h_tag->next = NULL;
	if (!h_tag->str)
	    return -1;

	if (last)
	    last->next = h_tag;
	else
	    h_type->tag = h_tag;
	
	last = h_tag;
    }
    va_end(ap);

    if (EOF == kputc('\n', &sh->text))
	return -1;

    int itype = (type[0]<<8) | type[1];
    if (-1 == sam_hdr_update_hashes(sh, itype, h_type))
	return -1;

    return h_type->order;
}